

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqlite_class.cpp
# Opt level: O2

void __thiscall test_cpp_db_sqlite::test_result_emptys::test_method(test_result_emptys *this)

{
  string *this_00;
  result r;
  string local_98;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  const_string local_48;
  const_string local_38;
  const_string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"select COL1, COL2 from TEST_TABLE where col1 = ?",
             (allocator<char> *)local_78);
  cpp_db::statement::statement
            ((statement *)local_68,&local_98,
             (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).con.
             super___shared_ptr<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  cpp_db::statement::execute<char_const(&)[13]>((statement *)&r,(char (*) [13])local_68);
  cpp_db::statement::~statement((statement *)local_68);
  this_00 = &local_98;
  std::__cxx11::string::~string((string *)this_00);
  local_28.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_28.m_end = "";
  local_38.m_begin = "";
  local_38.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_00,&local_28,0xa9,&local_38);
  local_98._M_dataplus._M_p._0_1_ = cpp_db::result::is_eof(&r);
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  local_78._0_8_ = "r.is_eof()";
  local_78._8_8_ = "";
  local_68[8] = false;
  local_68._0_8_ = &PTR__lazy_ostream_00192060;
  local_58 = boost::unit_test::lazy_ostream::inst;
  local_48.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_48.m_end = "";
  local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,(lazy_ostream *)local_68,&local_48,0xa9,CHECK,CHECK_PRED,
             0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_98.field_2._M_allocated_capacity);
  cpp_db::result::~result(&r);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_result_emptys)
{
    cpp_db::result r(cpp_db::statement("select COL1, COL2 from TEST_TABLE where col1 = ?", *con).execute("empty result"));
    BOOST_CHECK(r.is_eof());

}